

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t tohex(wchar_t c)

{
  wchar_t wVar1;
  
  wVar1 = c + L'\xffffffd0';
  if (9 < (uint)(c + L'\xffffffd0')) {
    if ((uint)(c + L'\xffffffbf') < 6) {
      return c + L'\xffffffc9';
    }
    wVar1 = L'\xffffffff';
    if ((uint)(c + L'\xffffff9f') < 6) {
      wVar1 = c + L'\xffffffa9';
    }
  }
  return wVar1;
}

Assistant:

static int
tohex(int c)
{
	if (c >= '0' && c <= '9')
		return (c - '0');
	else if (c >= 'A' && c <= 'F')
		return (c - 'A' + 10);
	else if (c >= 'a' && c <= 'f')
		return (c - 'a' + 10);
	else
		return (-1);
}